

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int fits_get_col_minmax(fitsfile *fptr,int colnum,double *datamin,double *datamax,int *status)

{
  double local_1fc8;
  double local_1fc0;
  long local_1fb8;
  double local_1fb0;
  double nulval;
  double array [1000];
  long local_60;
  long ii;
  long firstrow;
  long ntodo;
  long nrows;
  int *piStack_38;
  int anynul;
  int *status_local;
  double *datamax_local;
  double *datamin_local;
  fitsfile *pfStack_18;
  int colnum_local;
  fitsfile *fptr_local;
  
  piStack_38 = status;
  status_local = (int *)datamax;
  datamax_local = datamin;
  datamin_local._4_4_ = colnum;
  pfStack_18 = fptr;
  ffgky(fptr,0x29,"NAXIS2",&ntodo,(char *)0x0,status);
  ii = 1;
  local_1fb0 = -9.1191291391491e-36;
  *datamax_local = 9e+36;
  status_local[0] = 0x96844ff;
  status_local[1] = -0x3864eaa7;
  for (; ntodo != 0; ntodo = ntodo - local_1fb8) {
    if (ntodo < 100) {
      local_1fb8 = ntodo;
    }
    else {
      local_1fb8 = 100;
    }
    ffgcv(pfStack_18,0x52,datamin_local._4_4_,ii,1,local_1fb8,&local_1fb0,&nulval,
          (int *)((long)&nrows + 4),piStack_38);
    for (local_60 = 0; local_60 < local_1fb8; local_60 = local_60 + 1) {
      if ((array[local_60 + -1] != local_1fb0) || (NAN(array[local_60 + -1]) || NAN(local_1fb0))) {
        if (array[local_60 + -1] <= *datamax_local) {
          local_1fc0 = array[local_60 + -1];
        }
        else {
          local_1fc0 = *datamax_local;
        }
        *datamax_local = local_1fc0;
        if (*(double *)status_local < array[local_60 + -1] ||
            *(double *)status_local == array[local_60 + -1]) {
          local_1fc8 = array[local_60 + -1];
        }
        else {
          local_1fc8 = *(double *)status_local;
        }
        *(double *)status_local = local_1fc8;
      }
    }
    ii = local_1fb8 + ii;
  }
  return *piStack_38;
}

Assistant:

int fits_get_col_minmax(fitsfile *fptr, int colnum, double *datamin, 
			double *datamax, int *status)
/* 
   Simple utility routine to compute the min and max value in a column
*/
{
    int anynul;
    long nrows, ntodo, firstrow, ii;
    double array[1000], nulval;

    ffgky(fptr, TLONG, "NAXIS2", &nrows, NULL, status); /* no. of rows */

    firstrow = 1;
    nulval = DOUBLENULLVALUE;
    *datamin =  9.0E36;
    *datamax = -9.0E36;

    while(nrows)
    {
        ntodo = minvalue(nrows, 100);
        ffgcv(fptr, TDOUBLE, colnum, firstrow, 1, ntodo, &nulval, array,
              &anynul, status);

        for (ii = 0; ii < ntodo; ii++)
        {
            if (array[ii] != nulval)
            {
                *datamin = minvalue(*datamin, array[ii]);
                *datamax = maxvalue(*datamax, array[ii]);
            }
        }

        nrows -= ntodo;
        firstrow += ntodo;
    }
    return(*status);
}